

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duseltronik.hpp
# Opt level: O1

bool tao::pegtl::internal::
     duseltronik<ovf::detail::parse::v2::keyword_value_line,(tao::pegtl::apply_mode)1,(tao::pegtl::rewind_mode)2,ovf::detail::parse::v2::ovf_segment_header_action,ovf::detail::parse::v2::ovf_segment_header_control,(tao::pegtl::internal::dusel_mode)2>
     ::
     match<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>,ovf_file&,ovf_segment&>
               (memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *in,ovf_file *st,ovf_segment *st_1)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  bool bVar5;
  iterator_t *piVar6;
  action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  
  piVar6 = &(in->
            super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).m_current;
  pcVar1 = (in->
           super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).m_current.data;
  sVar2 = (in->
          super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ).m_current.byte;
  sVar3 = (in->
          super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ).m_current.line;
  sVar4 = (in->
          super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ).m_current.byte_in_line;
  bVar5 = rule_conjunction<ovf::detail::parse::v2::prefix,_tao::pegtl::pad<ovf::detail::parse::v2::keyword,_tao::pegtl::ascii::blank,_tao::pegtl::ascii::blank>,_tao::pegtl::ascii::istring<':'>,_tao::pegtl::pad<ovf::detail::parse::v2::value,_tao::pegtl::ascii::blank,_tao::pegtl::ascii::blank>,_ovf::detail::parse::v2::finish_line>
          ::
          match<(tao::pegtl::apply_mode)1,_(tao::pegtl::rewind_mode)0,_ovf::detail::parse::v2::ovf_segment_header_action,_ovf::detail::parse::v2::ovf_segment_header_control,_tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ovf_file_&,_ovf_segment_&>
                    (in,st,st_1);
  if (bVar5) {
    local_58.m_begin.data = pcVar1;
    local_58.m_begin.byte = sVar2;
    local_58.m_begin.line = sVar3;
    local_58.m_begin.byte_in_line = sVar4;
    local_58.m_input = in;
    ovf::detail::parse::v2::ovf_segment_header_action<ovf::detail::parse::v2::keyword_value_line>::
    apply<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
              (&local_58,st,st_1);
    piVar6 = (iterator_t *)0x0;
  }
  if (piVar6 != (iterator_t *)0x0) {
    piVar6->line = sVar3;
    piVar6->byte_in_line = sVar4;
    piVar6->data = pcVar1;
    piVar6->byte = sVar2;
  }
  return bVar5;
}

Assistant:

static bool match( Input& in, States&&... st )
            {
               auto m = in.template mark< rewind_mode::required >();

               Control< Rule >::start( static_cast< const Input& >( in ), st... );

               if( duseltronik< Rule, A, rewind_mode::active, Action, Control, dusel_mode::nothing >::match( in, st... ) ) {
                  Control< Rule >::template apply< Action >( m.iterator(), static_cast< const Input& >( in ), st... );
                  Control< Rule >::success( static_cast< const Input& >( in ), st... );
                  return m( true );
               }
               Control< Rule >::failure( static_cast< const Input& >( in ), st... );
               return false;
            }